

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O0

char * read_value(char **_p,char *end)

{
  char cVar1;
  char *local_38;
  char *pcStack_28;
  int c;
  char *last_ws;
  char *p;
  char *end_local;
  char **_p_local;
  
  last_ws = skip_ws(*_p,end);
  *_p = last_ws;
  pcStack_28 = (char *)0x0;
  do {
    if (end <= last_ws) {
LAB_001ba4f3:
      if (pcStack_28 == (char *)0x0) {
        local_38 = last_ws;
      }
      else {
        local_38 = pcStack_28;
      }
      return local_38;
    }
    cVar1 = *last_ws;
    if ((cVar1 == ' ') || (cVar1 == '\t')) {
      if (pcStack_28 == (char *)0x0) {
        pcStack_28 = last_ws;
      }
    }
    else {
      if (((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == '|')) {
        if (pcStack_28 == (char *)0x0) {
          pcStack_28 = last_ws;
        }
        goto LAB_001ba4f3;
      }
      pcStack_28 = (char *)0x0;
    }
    last_ws = last_ws + 1;
  } while( true );
}

Assistant:

static inline const char* read_value(const char*& _p, const char* end)
{
	const char* p = skip_ws(_p, end);
	_p = p;
	const char* last_ws = 0;
	while (p < end) {
		int c = *p;
		if (c == ' ' || c =='\t') {
			if (last_ws == 0)
				last_ws = p;
		} else if (c == '\n' || c == '\r' || c == '|') {
			if (last_ws == 0)
				last_ws = p;
			break;
		} else {
			last_ws = 0;
		}
		++p;
	}
	return last_ws ? last_ws : p;
}